

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_function_decl(gvisitor_t *self,gnode_function_decl_t *node)

{
  uint uVar1;
  size_t sVar2;
  gnode_compound_stmt_t *pgVar3;
  _Bool _Var4;
  uint32_t uVar5;
  undefined8 in_RAX;
  void *pvVar6;
  symboltable_t *table;
  long *plVar7;
  long lVar8;
  uint16_t uVar9;
  ulong uVar10;
  long lVar11;
  gnode_t *pgVar12;
  ulong uVar13;
  gnode_var_t *p;
  undefined8 uVar14;
  undefined4 uVar15;
  
  pgVar12 = *(gnode_t **)((*self->data)[2] + -8 + **self->data * 8);
  check_access_storage_specifiers(self,&node->base,pgVar12->tag,node->access,node->storage);
  node->env = pgVar12;
  plVar7 = *self->data;
  lVar8 = *plVar7;
  if (lVar8 == plVar7[1]) {
    lVar11 = 8;
    if (lVar8 != 0) {
      lVar11 = lVar8 * 2;
    }
    plVar7[1] = lVar11;
    pvVar6 = realloc((void *)plVar7[2],lVar11 << 3);
    plVar7 = *self->data;
    plVar7[2] = (long)pvVar6;
    lVar8 = *plVar7;
  }
  else {
    pvVar6 = (void *)plVar7[2];
  }
  *plVar7 = lVar8 + 1;
  *(gnode_function_decl_t **)((long)pvVar6 + lVar8 * 8) = node;
  table = symboltable_create(SYMTABLE_TAG_FUNC);
  symboltable_enter_scope(table);
  node->symtable = table;
  if ((node->params != (gnode_r *)0x0) && (sVar2 = node->params->n, sVar2 != 0)) {
    uVar13 = 0;
    do {
      if (uVar13 < node->params->n) {
        pgVar12 = node->params->p[uVar13];
      }
      else {
        pgVar12 = (gnode_t *)0x0;
      }
      *(gnode_function_decl_t **)(pgVar12 + 1) = node;
      _Var4 = symboltable_insert(table,*(char **)&pgVar12[1].block_length,pgVar12);
      if (_Var4) {
        uVar5 = symboltable_local_index(table);
        *(short *)&pgVar12[1].token.length = (short)uVar5;
      }
      else {
        report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar12,"Parameter %s redeclared.",
                     *(undefined8 *)&pgVar12[1].block_length);
      }
      uVar13 = uVar13 + 1;
    } while (sVar2 != uVar13);
  }
  uVar15 = (undefined4)((ulong)in_RAX >> 0x20);
  pgVar3 = node->block;
  if (((pgVar3 != (gnode_compound_stmt_t *)0x0) && (pgVar3->stmts != (gnode_r *)0x0)) &&
     (uVar13 = pgVar3->stmts->n, uVar13 != 0)) {
    uVar10 = 0;
    do {
      if (uVar10 < pgVar3->stmts->n) {
        pgVar12 = pgVar3->stmts->p[uVar10];
      }
      else {
        pgVar12 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar12);
      uVar15 = (undefined4)((ulong)in_RAX >> 0x20);
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  if (node->params == (gnode_r *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint16_t)node->params->n;
  }
  uVar5 = symboltable_exit_scope(table,(uint32_t *)0x0);
  if (uVar5 < 0xc9) {
    node->nlocals = (short)uVar5 - uVar9;
    node->nparams = uVar9;
  }
  else {
    uVar14 = CONCAT44(uVar15,uVar5);
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of local variables reached in function %s (max:%d found:%d).",
                 node->identifier,200,uVar14);
    uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
  }
  if ((node->uplist != (gupvalue_r *)0x0) && (uVar1 = (uint)node->uplist->n, 200 < uVar1)) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of upvalues reached in function %s (max:%d found:%d).",
                 node->identifier,200,CONCAT44(uVar15,uVar1));
  }
  lVar8 = **self->data;
  if (lVar8 != 0) {
    **self->data = lVar8 + -1;
  }
  return;
}

Assistant:

static void visit_function_decl (gvisitor_t *self, gnode_function_decl_t *node) {
    DEBUG_CODEGEN("visit_function_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    DECLARE_CONTEXT();
    bool is_class_ctx = OBJECT_ISA_CLASS(context_object);

    // create new function object
    uint16_t nparams = (node->params) ? (uint16_t)marray_size(*node->params) : 0;
    gravity_function_t *f = gravity_function_new((is_class_ctx) ? NULL : GET_VM(), node->identifier,
                                                 nparams, node->nlocals, 0, (void *)ircode_create(node->nlocals+nparams));

    // check if f is a special constructor function (init)
    // name must be CLASS_CONSTRUCTOR_NAME and context_object must be a class
    bool is_constructor = (string_cmp(node->identifier, CLASS_CONSTRUCTOR_NAME) == 0) && (is_class_ctx);

    // loop at each param to save name and check for default values
    // loop from 1 in order to skip implicit self argument
    size_t len = gnode_array_size(node->params);
    for (size_t i=1; i<len; ++i) {
        gnode_var_t *param = (gnode_var_t *)gnode_array_get(node->params, i);
        gravity_value_t name = VALUE_FROM_CSTRING(NULL, param->identifier);
        marray_push(gravity_value_t, f->pname, name);
        
        if (node->has_defaults) {
            // LOOP for each node->params[i]->expr and convert literal to gravity_value_t
            // if expr is NULL then compute value as UNDEFINED (and add each one to f->defaults preserving the index)
            gnode_literal_expr_t *literal = (gnode_literal_expr_t *)param->expr;
            gravity_value_t value = (literal) ? literal2value(literal) : VALUE_FROM_UNDEFINED;
            marray_push(gravity_value_t, f->pvalue, value);
        }
    }
    
    CONTEXT_PUSH(f);

    if (is_constructor) {
        // reserve first four instructions that could be later filled with a CALL to $init
        // see process_constructor for more information
        ircode_t *code = (ircode_t *)f->bytecode;
        if (!code) {report_error(self, (gnode_t *)node, "Invalid code context."); return;}
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
    }

    // process inner block
    ircode_t *code = (ircode_t *)f->bytecode;
    if (node->block) {
        gnode_array_each(node->block->stmts, {
            // process node
            visit(val);
            // reset temp registers after each node
            ircode_register_temps_clear(code);
        });
    }

    // check for upvalues
    if (node->uplist) f->nupvalues = (uint16_t)gnode_array_size(node->uplist);

    // remove current function
    CONTEXT_POP();

    // check for ircode errors
    if (ircode_iserror((ircode_t *)f->bytecode))
        report_error(self, (gnode_t *)node, "Maximum number of available registers used in function %s.", f->identifier);

    // store function in current context
    store_declaration(self, (gravity_object_t *)f, (node->storage == TOK_KEY_STATIC), node);

    // convert ircode to bytecode (postpone optimization of the constructor)
	if (!is_constructor) gravity_optimizer(f, self->bflag);
}